

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_date.cpp
# Opt level: O2

ScalarFunction * duckdb::MakeTimeFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_181;
  code *local_180 [2];
  code *local_170;
  code *local_168;
  LogicalType local_160 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_148;
  LogicalType local_130 [24];
  LogicalType local_118 [24];
  LogicalType local_100 [24];
  LogicalType local_e8 [24];
  BaseScalarFunction local_d0 [176];
  
  duckdb::LogicalType::LogicalType(local_118,BIGINT);
  duckdb::LogicalType::LogicalType(local_100,BIGINT);
  duckdb::LogicalType::LogicalType(local_e8,DOUBLE);
  __l._M_len = 3;
  __l._M_array = local_118;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_148,__l,&local_181);
  duckdb::LogicalType::LogicalType(local_160,TIME);
  local_180[1] = (code *)0x0;
  local_180[0] = ExecuteMakeTime<long>;
  local_168 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_170 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_130,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_130);
  std::_Function_base::~_Function_base((_Function_base *)local_180);
  duckdb::LogicalType::~LogicalType(local_160);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_148);
  lVar1 = 0x30;
  do {
    duckdb::LogicalType::~LogicalType(local_118 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  BaseScalarFunction::SetReturnsError(local_d0,&in_RDI->super_BaseScalarFunction);
  duckdb::BaseScalarFunction::~BaseScalarFunction(local_d0);
  return in_RDI;
}

Assistant:

ScalarFunction MakeTimeFun::GetFunction() {
	ScalarFunction function({LogicalType::BIGINT, LogicalType::BIGINT, LogicalType::DOUBLE}, LogicalType::TIME,
	                        ExecuteMakeTime<int64_t>);
	BaseScalarFunction::SetReturnsError(function);
	return function;
}